

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_SetButcherTables(ARKodeMem ark_mem)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  undefined8 in_RAX;
  ARKodeButcherTable pAVar6;
  ARKODE_DIRKTableID imethod;
  ARKODE_ERKTableID imethod_00;
  sunindextype Bliw;
  sunindextype Blrw;
  undefined8 local_38;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_SetButcherTables",
                    "Time step module memory is NULL.");
    return -0x15;
  }
  if (*(long *)((long)pvVar2 + 0x60) != 0) {
    return 0;
  }
  if (*(long *)((long)pvVar2 + 0x68) != 0) {
    return 0;
  }
  local_38 = in_RAX;
  if ((*(int *)((long)pvVar2 + 0x18) == 0) || (*(int *)((long)pvVar2 + 0x1c) == 0)) {
    if (*(int *)((long)pvVar2 + 0x1c) == 0) {
      imethod = ARKODE_DIRK_NONE;
      bVar4 = true;
      switch(*(undefined4 *)((long)pvVar2 + 0x50)) {
      case 2:
        imethod_00 = ARKODE_HEUN_EULER_2_1_2;
        break;
      case 3:
        imethod_00 = ARKODE_BOGACKI_SHAMPINE_4_2_3;
        break;
      case 4:
        imethod_00 = ARKODE_ZONNEVELD_5_3_4;
        break;
      case 5:
        imethod_00 = ARKODE_CASH_KARP_6_4_5;
        break;
      case 6:
        imethod_00 = ARKODE_VERNER_8_5_6;
        break;
      case 7:
      case 8:
        imethod_00 = ARKODE_FEHLBERG_13_7_8;
        break;
      default:
        bVar5 = false;
        arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                        "No explicit method at requested order, using q=6.");
        imethod = ARKODE_DIRK_NONE;
        imethod_00 = ARKODE_VERNER_8_5_6;
        goto LAB_004dde3c;
      }
      bVar5 = false;
    }
    else {
      bVar5 = true;
      imethod_00 = ARKODE_ERK_NONE;
      switch(*(undefined4 *)((long)pvVar2 + 0x50)) {
      case 2:
        imethod = ARKODE_MIN_DIRK_NUM;
        break;
      case 3:
        imethod = ARKODE_ARK324L2SA_DIRK_4_2_3;
        break;
      case 4:
        imethod = ARKODE_SDIRK_5_3_4;
        break;
      case 5:
        imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
        break;
      default:
        bVar4 = false;
        arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                        "No implicit method at requested order, using q=5.");
        imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
        goto LAB_004dde3c;
      }
      bVar4 = false;
    }
    goto LAB_004dde3c;
  }
  iVar1 = *(int *)((long)pvVar2 + 0x50);
  bVar4 = true;
  if (iVar1 - 2U < 2) {
    imethod = ARKODE_ARK324L2SA_DIRK_4_2_3;
    imethod_00 = ARKODE_ARK324L2SA_ERK_4_2_3;
  }
  else {
    if (iVar1 != 5) {
      if (iVar1 == 4) {
        imethod = ARKODE_ARK436L2SA_DIRK_6_3_4;
        imethod_00 = ARKODE_ARK436L2SA_ERK_6_3_4;
        goto LAB_004ddd93;
      }
      arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                      "No ImEx method at requested order, using q=5.");
    }
    imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
    imethod_00 = ARKODE_ARK548L2SA_ERK_8_4_5;
  }
LAB_004ddd93:
  bVar5 = true;
LAB_004dde3c:
  if (bVar4) {
    pAVar6 = ARKodeButcherTable_LoadERK(imethod_00);
    *(ARKodeButcherTable *)((long)pvVar2 + 0x60) = pAVar6;
  }
  if (bVar5) {
    pAVar6 = ARKodeButcherTable_LoadDIRK(imethod);
    *(ARKodeButcherTable *)((long)pvVar2 + 0x68) = pAVar6;
  }
  ARKodeButcherTable_Space
            (*(ARKodeButcherTable *)((long)pvVar2 + 0x60),(sunindextype *)&local_38,
             (sunindextype *)((long)&local_38 + 4));
  ark_mem->liw = ark_mem->liw + (long)(int)local_38;
  ark_mem->lrw = ark_mem->lrw + (long)local_38._4_4_;
  ARKodeButcherTable_Space
            (*(ARKodeButcherTable *)((long)pvVar2 + 0x68),(sunindextype *)&local_38,
             (sunindextype *)((long)&local_38 + 4));
  ark_mem->liw = ark_mem->liw + (long)(int)local_38;
  ark_mem->lrw = ark_mem->lrw + (long)local_38._4_4_;
  puVar3 = *(undefined8 **)((long)pvVar2 + 0x60);
  if (puVar3 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar2 + 0x5c) = *(undefined4 *)(puVar3 + 1);
    *(undefined8 *)((long)pvVar2 + 0x50) = *puVar3;
  }
  puVar3 = *(undefined8 **)((long)pvVar2 + 0x68);
  if (puVar3 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar2 + 0x5c) = *(undefined4 *)(puVar3 + 1);
    *(undefined8 *)((long)pvVar2 + 0x50) = *puVar3;
  }
  return 0;
}

Assistant:

int arkStep_SetButcherTables(ARKodeMem ark_mem)
{
  int etable, itable;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_SetButcherTables", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* if tables have already been specified, just return */
  if ( (step_mem->Be != NULL) || (step_mem->Bi != NULL) )
    return(ARK_SUCCESS);

  /* initialize table numbers to illegal values */
  etable = itable = -1;

  /**** ImEx methods ****/
  if (step_mem->explicit && step_mem->implicit) {

    switch (step_mem->q) {

    case(2):
    case(3):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_3;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_4;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No ImEx method at requested order, using q=5.");
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    }

  /**** implicit methods ****/
  } else if (step_mem->implicit) {

    switch (step_mem->q) {
    case(2):
      itable = ARKSTEP_DEFAULT_DIRK_2;
      break;
    case(3):
      itable = ARKSTEP_DEFAULT_DIRK_3;
      break;
    case(4):
      itable = ARKSTEP_DEFAULT_DIRK_4;
      break;
    case(5):
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No implicit method at requested order, using q=5.");
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    }

  /**** explicit methods ****/
  } else {

    switch (step_mem->q) {
    case(2):
      etable = ARKSTEP_DEFAULT_ERK_2;
      break;
    case(3):
      etable = ARKSTEP_DEFAULT_ERK_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ERK_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ERK_5;
      break;
    case(6):
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    case(7):
    case(8):
      etable = ARKSTEP_DEFAULT_ERK_8;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No explicit method at requested order, using q=6.");
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    }

  }

  if (etable > -1)
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
  if (itable > -1)
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] ARK stored values for stage numbers and method orders */
  if (step_mem->Be != NULL) {
    step_mem->stages = step_mem->Be->stages;
    step_mem->q = step_mem->Be->q;
    step_mem->p = step_mem->Be->p;
  }
  if (step_mem->Bi != NULL) {
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;
  }

  return(ARK_SUCCESS);
}